

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

void __thiscall network_pimpl::remove_client(network_pimpl *this,string *value)

{
  int iVar1;
  iterator __position;
  iterator __position_00;
  bool bVar2;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar3;
  string local_50;
  
  __position._M_current =
       (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      EventDataType::getOrigin_abi_cxx11_(&local_50,__position._M_current);
      if (local_50._M_string_length == value->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar2 = true;
        }
        else {
          iVar1 = bcmp(local_50._M_dataplus._M_p,(value->_M_dataplus)._M_p,local_50._M_string_length
                      );
          bVar2 = iVar1 == 0;
        }
      }
      else {
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        __position = std::vector<EventDataType,_std::allocator<EventDataType>_>::_M_erase
                               (&this->events,__position);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    } while (__position._M_current !=
             (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  __position_00._M_current =
       (this->hfdts).super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>._M_impl
       .super__Vector_impl_data._M_start;
  if (__position_00._M_current !=
      (this->hfdts).super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      HighFreqDataType::getOrigin_abi_cxx11_(&local_50,__position_00._M_current);
      if (local_50._M_string_length == value->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar2 = true;
        }
        else {
          iVar1 = bcmp(local_50._M_dataplus._M_p,(value->_M_dataplus)._M_p,local_50._M_string_length
                      );
          bVar2 = iVar1 == 0;
        }
      }
      else {
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        __position_00 =
             std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::_M_erase
                       (&this->hfdts,__position_00);
      }
      else {
        __position_00._M_current = __position_00._M_current + 1;
      }
    } while (__position_00._M_current !=
             (this->hfdts).super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::equal_range(&(this->clients)._M_t,value);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux(&(this->clients)._M_t,(_Base_ptr)pVar3.first._M_node,
                 (_Base_ptr)pVar3.second._M_node);
  return;
}

Assistant:

void network_pimpl::remove_client(const std::string &value){
    //First remove all events and hfdt's related to this client
    for(auto it = events.begin(); it != events.end(); ){
        if(it->getOrigin() == value)
            it = events.erase(it);
        else ++it;
    }
    //Remove hfdt's
    for(auto it = hfdts.begin(); it != hfdts.end(); ){
        if(it->getOrigin() == value)
            it = hfdts.erase(it);
        else ++it;
    }
    //Remove name from clients
    clients.erase(value);
}